

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O0

bool __thiscall
GeneratedSaxParser::ParserTemplateBase::handleError
          (ParserTemplateBase *this,Severity severity,ErrorType errorType,StringHash elementHash,
          ParserChar *attribute,ParserChar *additionalText)

{
  int iVar1;
  char *__s;
  char *attributeName;
  undefined4 in_EDX;
  int in_ESI;
  Parser *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  String *in_R9;
  bool handlerWantsToAbort;
  ParserError error;
  IErrorHandler *errorHandler;
  Parser *in_stack_fffffffffffffee0;
  ErrorType in_stack_fffffffffffffee8;
  Severity in_stack_fffffffffffffeec;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  ParserTemplateBase *in_stack_fffffffffffffef8;
  allocator<char> *columnNumber;
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [80];
  IErrorHandler *local_38;
  String *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  undefined4 local_18;
  int local_14;
  byte local_1;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_38 = Parser::getErrorHandler(in_RDI);
  if (local_38 == (IErrorHandler *)0x0) {
    local_1 = local_14 == 1;
  }
  else {
    iVar1 = local_14;
    __s = getNameByStringHash(in_stack_fffffffffffffef8,
                              (StringHash *)
                              CONCAT17(in_stack_fffffffffffffef7,
                                       CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)
                                      ));
    Parser::getLineNumber(in_stack_fffffffffffffee0);
    attributeName = (char *)Parser::getColumnNumber(in_stack_fffffffffffffee0);
    if (local_30 == (String *)0x0) {
      local_30 = (String *)0xcb18f2;
    }
    columnNumber = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,__s,(allocator<char> *)CONCAT44(local_18,iVar1));
    ParserError::ParserError
              ((ParserError *)
               CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
               in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,(char *)local_a8,attributeName,
               0xc58834,(size_t)columnNumber,local_30);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    iVar1 = (*local_38->_vptr_IErrorHandler[2])(local_38,local_88);
    local_1 = (byte)iVar1 & 1;
    if (local_14 == 1) {
      local_1 = 1;
    }
    ParserError::~ParserError((ParserError *)0xc588aa);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ParserTemplateBase::handleError( ParserError::Severity severity,
        ParserError::ErrorType errorType,
        StringHash elementHash,
        const ParserChar* attribute,
        const ParserChar* additionalText /*= ""*/ )
    {
        IErrorHandler* errorHandler = getErrorHandler();
        if ( !errorHandler )
            return (severity == ParserError::SEVERITY_CRITICAL) ? true : false;

        ParserError error(severity,
            errorType,
            getNameByStringHash(elementHash),
            attribute,
            getLineNumber(),
            getColumnNumber(),
            additionalText ? (const char*)additionalText : "");
        bool handlerWantsToAbort = errorHandler->handleError(error);

        return (severity == ParserError::SEVERITY_CRITICAL) ? true : handlerWantsToAbort;
    }